

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O0

S2Point * S2::InterpolateAtDistance
                    (S2Point *__return_storage_ptr__,S1Angle ax_angle,S2Point *a,S2Point *b)

{
  bool bVar1;
  ostream *poVar2;
  double dVar3;
  FloatType FVar4;
  double local_130;
  Vector3<double> local_128;
  double local_110;
  Vector3<double> local_108;
  D local_f0;
  byte local_d1;
  S2LogMessage local_d0;
  S2LogMessageVoidify local_b9;
  Vector3<double> local_b8;
  undefined1 local_a0 [8];
  Vector3_d tangent;
  Vector3_d normal;
  S2LogMessage local_68;
  S2LogMessageVoidify local_55 [20];
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  double local_28;
  double ax;
  S2Point *b_local;
  S2Point *a_local;
  S1Angle ax_angle_local;
  
  ax = (double)b;
  b_local = a;
  a_local = (S2Point *)ax_angle.radians_;
  local_28 = S1Angle::radians((S1Angle *)&a_local);
  bVar1 = IsUnitLength(b_local);
  local_41 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x2e,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar2 = S2LogMessage::stream(&local_40);
    poVar2 = std::operator<<(poVar2,"Check failed: S2::IsUnitLength(a) ");
    S2LogMessageVoidify::operator&(&local_29,poVar2);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  bVar1 = IsUnitLength((S2Point *)ax);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x2f,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_68);
    poVar2 = std::operator<<(poVar2,"Check failed: S2::IsUnitLength(b) ");
    S2LogMessageVoidify::operator&(local_55,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
  }
  RobustCrossProd((Vector3_d *)(tangent.c_ + 2),b_local,(S2Point *)ax);
  Vector3<double>::CrossProd
            ((Vector3<double> *)local_a0,(Vector3<double> *)(tangent.c_ + 2),b_local);
  Vector3<double>::Vector3(&local_b8,0.0,0.0,0.0);
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)local_a0,&local_b8);
  local_d1 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x36,kFatal,(ostream *)&std::cerr);
    local_d1 = 1;
    poVar2 = S2LogMessage::stream(&local_d0);
    poVar2 = std::operator<<(poVar2,"Check failed: tangent != S2Point(0, 0, 0) ");
    S2LogMessageVoidify::operator&(&local_b9,poVar2);
  }
  if ((local_d1 & 1) == 0) {
    local_110 = cos(local_28);
    util::math::internal_vector::operator*
              (&local_108,&local_110,(BasicVector<Vector3,_double,_3UL> *)b_local);
    dVar3 = sin(local_28);
    FVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                      ((BasicVector<Vector3,_double,_3UL> *)local_a0);
    local_130 = dVar3 / FVar4;
    util::math::internal_vector::operator*
              (&local_128,&local_130,(BasicVector<Vector3,_double,_3UL> *)local_a0);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
              (&local_f0,(BasicVector<Vector3,_double,_3UL> *)&local_108,&local_128);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
              (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_f0);
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d0);
}

Assistant:

S2Point InterpolateAtDistance(S1Angle ax_angle,
                              const S2Point& a, const S2Point& b) {
  double ax = ax_angle.radians();

  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));

  // Use RobustCrossProd() to compute the tangent vector at A towards B.  The
  // result is always perpendicular to A, even if A=B or A=-B, but it is not
  // necessarily unit length.  (We effectively normalize it below.)
  Vector3_d normal = S2::RobustCrossProd(a, b);
  Vector3_d tangent = normal.CrossProd(a);
  S2_DCHECK(tangent != S2Point(0, 0, 0));

  // Now compute the appropriate linear combination of A and "tangent".  With
  // infinite precision the result would always be unit length, but we
  // normalize it anyway to ensure that the error is within acceptable bounds.
  // (Otherwise errors can build up when the result of one interpolation is
  // fed into another interpolation.)
  return (cos(ax) * a + (sin(ax) / tangent.Norm()) * tangent).Normalize();
}